

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.hpp
# Opt level: O3

void __thiscall
qclab::qgates::CPhase<std::complex<double>_>::CPhase
          (CPhase<std::complex<double>_> *this,int control,int target,real_type cos,real_type sin,
          int controlState)

{
  Phase<std::complex<double>_> *pPVar1;
  
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_004ef318;
  pPVar1 = (Phase<std::complex<double>_> *)operator_new(0x20);
  (pPVar1->super_QGate1<std::complex<double>_>).qubit_ = target;
  if (target < 0) {
    __assert_fail("qubit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QGate1.hpp"
                  ,0x21,
                  "qclab::qgates::QGate1<std::complex<double>>::QGate1(const int) [T = std::complex<double>]"
                 );
  }
  (pPVar1->super_QGate1<std::complex<double>_>).field_0xc = 0;
  (pPVar1->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_> =
       (QObject<std::complex<double>_>)&PTR_nbQubits_004ebcd0;
  (pPVar1->angle_).cos_ = cos;
  (pPVar1->angle_).sin_ = sin;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::Phase<std::complex<double>_>,_std::default_delete<qclab::qgates::Phase<std::complex<double>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::Phase<std::complex<double>_>_*,_std::default_delete<qclab::qgates::Phase<std::complex<double>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::Phase<std::complex<double>_>_*,_false>._M_head_impl = pPVar1
  ;
  if (-1 < control) {
    if (target != control) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CPhase.hpp"
                  ,0x51,
                  "qclab::qgates::CPhase<std::complex<double>>::CPhase(const int, const int, const real_type, real_type, const int) [T = std::complex<double>]"
                 );
  }
  __assert_fail("control >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CPhase.hpp"
                ,0x50,
                "qclab::qgates::CPhase<std::complex<double>>::CPhase(const int, const int, const real_type, real_type, const int) [T = std::complex<double>]"
               );
}

Assistant:

CPhase( const int control , const int target ,
                const real_type cos , real_type sin ,
                const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< Phase< T > >( target , cos , sin ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }